

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes)

{
  pointer *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  int iVar3;
  cmGlobalNinjaGenerator *pcVar4;
  cmake *this_02;
  string *in_base;
  cmMakefile *pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  undefined4 extraout_var;
  pointer this_03;
  cmOutputConverter *local_400;
  string local_338;
  undefined1 local_318 [8];
  string cmdLine;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string *compileCmd_1;
  undefined1 local_2a8 [8];
  string cmdVar_1;
  string *compileCmd;
  string local_278;
  allocator<char> local_251;
  string local_250;
  undefined1 local_230 [8];
  string cmdVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string local_1d8;
  undefined1 local_1b8 [8];
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *objectFileDir_local;
  string *objectFileName_local;
  string *objectDir_local;
  string *sourceFileName_local;
  string *language_local;
  cmNinjaTargetGenerator *this_local;
  
  pcVar5 = (this->super_cmCommonTargetGenerator).Makefile;
  local_38 = objectFileDir;
  objectFileDir_local = objectFileName;
  objectFileName_local = objectDir;
  objectDir_local = sourceFileName;
  sourceFileName_local = language;
  language_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_EXPORT_COMPILE_COMMANDS",&local_59);
  bVar2 = cmMakefile::IsOn(pcVar5,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_1b8,(string *)objectDir_local);
    bVar2 = cmsys::SystemTools::FileIsFullPath(objectDir_local);
    if (!bVar2) {
      pcVar4 = GetGlobalGenerator(this);
      this_02 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)pcVar4);
      in_base = cmake::GetHomeOutputDirectory_abi_cxx11_(this_02);
      cmsys::SystemTools::CollapseFullPath(&local_1d8,(string *)local_1b8,in_base);
      std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    cmOutputConverter::ConvertToOutputFormat
              ((string *)
               &compileCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_1b8,SHELL);
    this_00 = &compileCmds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=((string *)local_1b8,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cmdVar.field_2 + 8));
    bVar2 = std::operator==(sourceFileName_local,"CUDA");
    if (bVar2) {
      std::__cxx11::string::string((string *)local_230);
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"CUDA_SEPARABLE_COMPILATION",&local_251);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)local_230,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
      }
      else {
        pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"CUDA_PTX_COMPILATION",
                   (allocator<char> *)((long)&compileCmd + 7));
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator((allocator<char> *)((long)&compileCmd + 7));
        if (bVar2) {
          std::__cxx11::string::operator=((string *)local_230,"CMAKE_CUDA_COMPILE_PTX_COMPILATION");
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)local_230,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
        }
      }
      pcVar5 = GetMakefile(this);
      cmdVar_1.field_2._8_8_ = cmMakefile::GetRequiredDefinition(pcVar5,(string *)local_230);
      cmSystemTools::ExpandListArgument
                ((string *)cmdVar_1.field_2._8_8_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cmdVar.field_2 + 8),false);
      std::__cxx11::string::~string((string *)local_230);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compileCmd_1,"CMAKE_",sourceFileName_local);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compileCmd_1,"_COMPILE_OBJECT");
      std::__cxx11::string::~string((string *)&compileCmd_1);
      pcVar5 = GetMakefile(this);
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>,_true,_true>
            )cmMakefile::GetRequiredDefinition(pcVar5,(string *)local_2a8);
      cmSystemTools::ExpandListArgument
                ((string *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&cmdVar.field_2 + 8),false);
      std::__cxx11::string::~string((string *)local_2a8);
    }
    pcVar6 = GetLocalGenerator(this);
    iVar3 = (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&__range1,(pointer)CONCAT44(extraout_var,iVar3));
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&cmdVar.field_2 + 8);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar2) {
      cmdLine.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      this_03 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&__range1);
      pcVar6 = GetLocalGenerator(this);
      local_400 = (cmOutputConverter *)0x0;
      if (pcVar6 != (cmLocalNinjaGenerator *)0x0) {
        local_400 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_03,local_400,(string *)cmdLine.field_2._8_8_,
                 (RuleVariables *)((long)&escapedSourceFileName.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar6 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&local_338);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_318,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8),&local_338,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&local_338);
    pcVar4 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar4,(string *)local_318,objectDir_local);
    std::__cxx11::string::~string((string *)local_318);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&cmdVar.field_2 + 8));
    std::__cxx11::string::~string((string *)local_1b8);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes)
{
  if (!this->Makefile->IsOn("CMAKE_EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (language == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + language + "_COMPILE_OBJECT";
    const std::string& compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::string& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName);
}